

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c64.cc
# Opt level: O3

void __thiscall testbench::C64::C64(C64 *this)

{
  memory *this_00;
  
  commodore::commodore(&this->super_commodore);
  (this->super_commodore).super_machine_6502.super_machine_implementation.super_machine.
  _vptr_machine = (_func_int **)&PTR_run_0010bcd8;
  this_00 = &(this->super_commodore).super_machine_6502.memory;
  memory::add_ROM(this_00,0xa000,&(anonymous_namespace)::c64_basic,0x2000);
  memory::add_ROM(this_00,0xe000,&DAT_0010e350,0x4b7);
  memory::add_RAM(this_00,0,0x10000);
  *(this->super_commodore).mem_top_high = 0xa0;
  *(this->super_commodore).mem_top_low = '\0';
  *(this->super_commodore).mem_bottom_high = '\b';
  *(this->super_commodore).mem_bottom_low = '\0';
  *(this->super_commodore).basic_entry_high = 0xe3;
  *(this->super_commodore).basic_entry_low = 0x94;
  *(this->super_commodore).screen_width = '(';
  *(this->super_commodore).screen_height = '\x19';
  return;
}

Assistant:

C64()
    {
        memory.add_ROM(0xa000, c64_basic, 0x2000);
        memory.add_ROM(0xe000, c64_basic + 0x2000, c64_basic_len - 0x2000);
        memory.add_RAM(0, 0x10000);

        *mem_top_high = 0xa0;
        *mem_top_low = 0x00;
        *mem_bottom_high = 0x08;
        *mem_bottom_low = 0x00;
        *basic_entry_high = 0xe3;
        *basic_entry_low = 0x94;
        *screen_width = 40;
        *screen_height = 25;
    }